

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::BlendShape>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,BlendShape *bs,
               string *warn,string *err,PrimReconstructOptions *options)

{
  Property *this;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  ostringstream oVar3;
  __type _Var4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  value_type *value;
  size_type sVar8;
  mapped_type *this_00;
  _Base_ptr p_Var9;
  Property *pPVar10;
  long lVar11;
  _Rb_tree_header *p_Var12;
  Property *args_1;
  _Base_ptr __x;
  TypedAttribute<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
  *in_stack_fffffffffffffcb8;
  allocator local_33a;
  allocator local_339;
  _Base_ptr local_338;
  ParseResult ret;
  string attr_type_name;
  undefined1 local_2c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2b8;
  optional<std::vector<int,std::allocator<int>>> *local_2a8;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_2a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_298;
  string *local_290;
  string *local_288;
  string local_280;
  char *kPointIndices;
  char *kNormalOffsets;
  char *kOffsets;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string local_218 [32];
  ostringstream ss_e;
  storage_t<tinyusdz::Token> asStack_1e8 [11];
  string local_70 [32];
  string local_50 [32];
  
  kOffsets = "offsets";
  kNormalOffsets = "normalOffsets";
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  kPointIndices = "pointIndices";
  p_Var9 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var12 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  local_288 = (string *)&bs->offsets;
  local_290 = (string *)&bs->normalOffsets;
  local_2a0 = &(bs->pointIndices)._paths;
  local_2a8 = (optional<std::vector<int,std::allocator<int>>> *)&(bs->pointIndices)._attrib;
  local_298 = &bs->props;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var9 == p_Var12) {
LAB_001b7c1b:
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&table);
      return (_Rb_tree_header *)p_Var9 == p_Var12;
    }
    __x = p_Var9 + 1;
    ::std::__cxx11::string::string(local_50,(string *)__x);
    this = (Property *)(p_Var9 + 2);
    ::std::__cxx11::string::string((string *)&ss_e,"offsets",(allocator *)&attr_type_name);
    pPVar10 = (Property *)&ss_e;
    (anonymous_namespace)::
    ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
              (&ret,(_anonymous_namespace_ *)&table,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50,(string *)this,(Property *)&ss_e,local_288,in_stack_fffffffffffffcb8);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    iVar6 = 0;
    if ((ret.code & ~AlreadyProcessed) == Success) {
      bVar5 = false;
      iVar6 = 3;
    }
    else {
      bVar5 = true;
      if (ret.code != Unmatched) {
        local_338 = __x;
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar7 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xbd2);
        ::std::operator<<(poVar7," ");
        ::std::__cxx11::string::string
                  ((string *)local_2c8,"Parsing attribute `{}` failed. Error: {}",
                   (allocator *)&local_280);
        fmt::format<char_const*,std::__cxx11::string>
                  (&attr_type_name,(fmt *)local_2c8,(string *)&kOffsets,(char **)&ret.err,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar10);
        poVar7 = ::std::operator<<((ostream *)&ss_e,(string *)&attr_type_name);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &attr_type_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err)
          ;
          ::std::__cxx11::string::operator=((string *)err,(string *)&attr_type_name);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        bVar5 = false;
        iVar6 = 1;
        __x = local_338;
      }
    }
    ::std::__cxx11::string::_M_dispose();
    if (bVar5) {
      ::std::__cxx11::string::string(local_70,(string *)__x);
      ::std::__cxx11::string::string((string *)&ss_e,"normalOffsets",(allocator *)&attr_type_name);
      pPVar10 = this;
      args_1 = (Property *)&ss_e;
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                (&ret,(_anonymous_namespace_ *)&table,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,(string *)this,(Property *)&ss_e,local_290,in_stack_fffffffffffffcb8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar6 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar5 = false;
        iVar6 = 3;
      }
      else {
        bVar5 = true;
        if (ret.code != Unmatched) {
          local_338 = __x;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar7 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xbd3);
          ::std::operator<<(poVar7," ");
          ::std::__cxx11::string::string
                    ((string *)local_2c8,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&local_280);
          pPVar10 = (Property *)&ret.err;
          fmt::format<char_const*,std::__cxx11::string>
                    (&attr_type_name,(fmt *)local_2c8,(string *)&kNormalOffsets,(char **)pPVar10,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar7 = ::std::operator<<((ostream *)&ss_e,(string *)&attr_type_name);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &attr_type_name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&attr_type_name);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar5 = false;
          iVar6 = 1;
          __x = local_338;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar5) goto LAB_001b7ab6;
      ::std::__cxx11::string::string(local_218,(string *)__x);
      ::std::__cxx11::string::string((string *)&local_280,"pointIndices",&local_33a);
      ret.err._M_dataplus._M_p = (pointer)&ret.err.field_2;
      ret.err._M_string_length = 0;
      ret.err.field_2._M_local_buf[0] = '\0';
      iVar6 = ::std::__cxx11::string::compare(local_218);
      if (iVar6 == 0) {
        Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)this);
        tinyusdz::value::TypeTraits<std::vector<int,std::allocator<int>>>::type_name_abi_cxx11_();
        _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ss_e,&attr_type_name);
        if (!_Var4) {
          tinyusdz::value::TypeTraits<std::vector<int,std::allocator<int>>>::
          underlying_type_name_abi_cxx11_();
          _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_2c8,&attr_type_name);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (_Var4) goto LAB_001b7623;
          ret.code = TypeMismatch;
          ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_e);
          poVar7 = ::std::operator<<((ostream *)asStack_1e8,"Property type mismatch. ");
          poVar7 = ::std::operator<<(poVar7,(string *)&local_280);
          poVar7 = ::std::operator<<(poVar7," expects type `");
          tinyusdz::value::TypeTraits<std::vector<int,std::allocator<int>>>::type_name_abi_cxx11_();
          poVar7 = ::std::operator<<(poVar7,(string *)local_2c8);
          poVar7 = ::std::operator<<(poVar7,"` but defined as type `");
          poVar7 = ::std::operator<<(poVar7,(string *)&attr_type_name);
          ::std::operator<<(poVar7,"`");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)&ret.err,(string *)local_2c8);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_e);
          goto LAB_001b78d6;
        }
        ::std::__cxx11::string::_M_dispose();
LAB_001b7623:
        p_Var1 = p_Var9[6]._M_parent;
        p_Var2 = p_Var9[6]._M_left;
        if (p_Var2 != p_Var1) {
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (local_2a0,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&p_Var9[6]._M_parent
                    );
        }
        iVar6 = *(int *)((long)&p_Var9[0x17]._M_parent + 4);
        if (iVar6 == 0) {
          lVar11 = 0x208;
LAB_001b76a0:
          (&(bs->pointIndices)._metas.interpolation.has_value_)[lVar11] = true;
LAB_001b7888:
          AttrMetas::operator=(&(bs->pointIndices)._metas,(AttrMetas *)(p_Var9 + 7));
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&table,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_280
                    );
          ret.code = Success;
        }
        else if (iVar6 == 1) {
          if (p_Var9[3]._M_color == _S_black) {
            if (p_Var9[5]._M_left != p_Var9[5]._M_parent) {
              ret.code = VariabilityMismatch;
              goto LAB_001b78c9;
            }
            bVar5 = Attribute::is_blocked((Attribute *)this);
            lVar11 = 0x248;
            if (bVar5) goto LAB_001b76a0;
            bVar5 = primvar::PrimVar::has_value((PrimVar *)&p_Var9[4]._M_parent);
            if (!bVar5) goto LAB_001b7883;
            Attribute::get_value<std::vector<int,std::allocator<int>>>
                      ((optional<std::vector<int,_std::allocator<int>_>_> *)local_2c8,
                       (Attribute *)this);
            oVar3 = local_2c8[0];
            ss_e = local_2c8[0];
            if (local_2c8[0] == (ostringstream)0x1) {
              asStack_1e8[0].data.__align = aStack_2b8._M_allocated_capacity;
              asStack_1e8[0]._8_8_ = aStack_2b8._8_8_;
              local_2c8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              aStack_2b8._M_allocated_capacity = 0;
              aStack_2b8._8_8_ = 0;
              nonstd::optional_lite::optional<std::vector<int,_std::allocator<int>_>_>::~optional
                        ((optional<std::vector<int,_std::allocator<int>_>_> *)local_2c8);
              value = nonstd::optional_lite::optional<std::vector<int,_std::allocator<int>_>_>::
                      value((optional<std::vector<int,_std::allocator<int>_>_> *)&ss_e);
              nonstd::optional_lite::optional<std::vector<int,std::allocator<int>>>::operator=
                        (local_2a8,value);
            }
            else {
              nonstd::optional_lite::optional<std::vector<int,_std::allocator<int>_>_>::~optional
                        ((optional<std::vector<int,_std::allocator<int>_>_> *)local_2c8);
              ret.code = VariabilityMismatch;
              ::std::__cxx11::string::assign((char *)&ret.err);
            }
            nonstd::optional_lite::optional<std::vector<int,_std::allocator<int>_>_>::~optional
                      ((optional<std::vector<int,_std::allocator<int>_>_> *)&ss_e);
            if (oVar3 == (ostringstream)0x0) goto LAB_001b78d6;
            goto LAB_001b7888;
          }
          ret.code = VariabilityMismatch;
          ::std::__cxx11::string::string
                    ((string *)local_2c8,"Attribute `{}` must be `uniform` variability.",&local_339)
          ;
          fmt::format<std::__cxx11::string>
                    ((string *)&ss_e,(fmt *)local_2c8,&local_280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar10);
          ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        else {
LAB_001b7883:
          if (p_Var2 != p_Var1) goto LAB_001b7888;
          ret.code = InternalError;
LAB_001b78c9:
          ::std::__cxx11::string::assign((char *)&ret.err);
        }
LAB_001b78d6:
        ::std::__cxx11::string::_M_dispose();
      }
      else {
        ret.code = Unmatched;
      }
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar6 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar5 = false;
        iVar6 = 3;
      }
      else {
        bVar5 = true;
        if (ret.code != Unmatched) {
          local_338 = __x;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar7 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xbd4);
          ::std::operator<<(poVar7," ");
          ::std::__cxx11::string::string
                    ((string *)local_2c8,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&local_280);
          fmt::format<char_const*,std::__cxx11::string>
                    (&attr_type_name,(fmt *)local_2c8,(string *)&kPointIndices,(char **)&ret.err,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar7 = ::std::operator<<((ostream *)&ss_e,(string *)&attr_type_name);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &attr_type_name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&attr_type_name);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar5 = false;
          iVar6 = 1;
          __x = local_338;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar5) goto LAB_001b7ab6;
      sVar8 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)__x);
      if (sVar8 == 0) {
        this_00 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  ::operator[](local_298,(key_type *)__x);
        Property::operator=(this_00,this);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&table,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x);
      }
      sVar8 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)__x);
      if (sVar8 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar7 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xbd6);
        ::std::operator<<(poVar7," ");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                         "Unsupported/unimplemented property: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x);
        poVar7 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::string::_M_dispose();
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &attr_type_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err)
          ;
          ::std::__cxx11::string::operator=((string *)err,(string *)&ret);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        goto LAB_001b7c1b;
      }
    }
    else {
LAB_001b7ab6:
      if ((iVar6 != 3) && (iVar6 != 0)) goto LAB_001b7c1b;
    }
    p_Var9 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9);
  } while( true );
}

Assistant:

bool ReconstructPrim<BlendShape>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    BlendShape *bs,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)spec;
  (void)warn;
  (void)references;
  (void)options;

  DCOUT("Reconstruct BlendShape");

  constexpr auto kOffsets = "offsets";
  constexpr auto kNormalOffsets = "normalOffsets";
  constexpr auto kPointIndices = "pointIndices";

  std::set<std::string> table;
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, kOffsets, BlendShape, bs->offsets)
    PARSE_TYPED_ATTRIBUTE(table, prop, kNormalOffsets, BlendShape, bs->normalOffsets)
    PARSE_TYPED_ATTRIBUTE(table, prop, kPointIndices, BlendShape, bs->pointIndices)
    ADD_PROPERTY(table, prop, Skeleton, bs->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

#if 0 // TODO: Check required properties exist in strict mode.
  // `offsets` and `normalOffsets` are required property
  if (!table.count(kOffsets)) {
    PUSH_ERROR_AND_RETURN("`offsets` property is missing. `uniform vector3f[] offsets` is a required property.");
  }
  if (!table.count(kNormalOffsets)) {
    PUSH_ERROR_AND_RETURN("`normalOffsets` property is missing. `uniform vector3f[] normalOffsets` is a required property.");
  }
#endif

  return true;
}